

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

void __thiscall
HumanPlayerStrategy::HumanPlayerStrategy(HumanPlayerStrategy *this,HumanPlayerStrategy *toCopy)

{
  string *psVar1;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,&toCopy->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013d870;
  (this->super_PlayerStrategy).exchangingCardType =
       (toCopy->super_PlayerStrategy).exchangingCardType;
  (this->super_PlayerStrategy).armiesToPlace = (toCopy->super_PlayerStrategy).armiesToPlace;
  (this->super_PlayerStrategy).player = (toCopy->super_PlayerStrategy).player;
  (this->super_PlayerStrategy).from = (toCopy->super_PlayerStrategy).from;
  (this->super_PlayerStrategy).to = (toCopy->super_PlayerStrategy).to;
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"HUMAN","");
  (this->super_PlayerStrategy).strategyName = psVar1;
  return;
}

Assistant:

HumanPlayerStrategy::HumanPlayerStrategy(const HumanPlayerStrategy& toCopy)  : PlayerStrategy(toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string("HUMAN");
}